

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FFSBitfieldSet(FFSMetadataInfoStruct *MBase,int Bit)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  ulong *in_RDI;
  int ElementBit;
  int Element;
  
  iVar1 = (int)((ulong)(long)in_ESI >> 6);
  if (*in_RDI <= (ulong)(long)iVar1) {
    pvVar2 = realloc((void *)in_RDI[1],(long)(iVar1 + 1) << 3);
    in_RDI[1] = (ulong)pvVar2;
    memset((void *)(in_RDI[1] + *in_RDI * 8),0,(((long)iVar1 - *in_RDI) + 1) * 8);
    *in_RDI = (long)(iVar1 + 1);
  }
  *(ulong *)(in_RDI[1] + (long)iVar1 * 8) =
       1L << ((byte)in_ESI & 0x3f) | *(ulong *)(in_RDI[1] + (long)iVar1 * 8);
  return;
}

Assistant:

static void FFSBitfieldSet(struct FFSMetadataInfoStruct *MBase, int Bit)
{
    int Element = Bit / (sizeof(size_t) * 8);
    int ElementBit = Bit % (sizeof(size_t) * 8);
    if (Element >= MBase->BitFieldCount)
    {
        MBase->BitField = realloc(MBase->BitField, sizeof(size_t) * (Element + 1));
        memset(MBase->BitField + MBase->BitFieldCount, 0,
               (Element - MBase->BitFieldCount + 1) * sizeof(size_t));
        MBase->BitFieldCount = Element + 1;
    }
    MBase->BitField[Element] |= ((size_t)1 << ElementBit);
}